

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_aesimc_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint32_t uVar1;
  byte local_68 [8];
  ZMMReg tmp;
  ZMMReg *pZStack_20;
  int i;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  pZStack_20 = s;
  s_local = d;
  d_local = (ZMMReg *)env;
  memcpy(local_68,s,0x40);
  for (tmp._l_ZMMReg[0xf] = 0; (int)tmp._l_ZMMReg[0xf] < 4;
      tmp._l_ZMMReg[0xf] = tmp._l_ZMMReg[0xf] + 1) {
    uVar1 = bswap32(AES_imc[local_68[(int)(tmp._l_ZMMReg[0xf] << 2)]][0] ^
                    AES_imc[local_68[(int)(tmp._l_ZMMReg[0xf] * 4 + 1)]][1] ^
                    AES_imc[local_68[(int)(tmp._l_ZMMReg[0xf] * 4 + 2)]][2] ^
                    AES_imc[local_68[(int)(tmp._l_ZMMReg[0xf] * 4 + 3)]][3]);
    s_local->_l_ZMMReg[(int)tmp._l_ZMMReg[0xf]] = uVar1;
  }
  return;
}

Assistant:

void glue(helper_aesimc, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int i;
    Reg tmp = *s;

    for (i = 0 ; i < 4 ; i++) {
        d->L(i) = bswap32(AES_imc[tmp.B(4*i+0)][0] ^
                          AES_imc[tmp.B(4*i+1)][1] ^
                          AES_imc[tmp.B(4*i+2)][2] ^
                          AES_imc[tmp.B(4*i+3)][3]);
    }
}